

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

string * __thiscall
flow::MatchInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,MatchInstr *this)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  switch(this->op_) {
  case Same:
    paVar2 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"match.same","");
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_40);
    _Var1._M_p = local_40._M_dataplus._M_p;
    break;
  case Head:
    paVar2 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"match.head","");
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_60);
    _Var1._M_p = local_60._M_dataplus._M_p;
    break;
  case Tail:
    paVar2 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"match.tail","");
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_80);
    _Var1._M_p = local_80._M_dataplus._M_p;
    break;
  case RegExp:
    paVar2 = &local_a0.field_2;
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"match.re","");
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_a0);
    _Var1._M_p = local_a0._M_dataplus._M_p;
    break;
  default:
    abort();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p,paVar2->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<Instr> StoreInstr::clone() {
  return std::make_unique<StoreInstr>(variable(), index(), source(), name());
}